

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O2

result_type_conflict4 __thiscall
effolkronium::
basic_random_local<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,effolkronium::seeder_default,std::uniform_int_distribution,std::uniform_real_distribution,std::bernoulli_distribution>
::get<std::gamma_distribution<double>,double>
          (basic_random_local<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,effolkronium::seeder_default,std::uniform_int_distribution,std::uniform_real_distribution,std::bernoulli_distribution>
           *this,double *args)

{
  result_type_conflict4 rVar1;
  gamma_distribution<double> local_50;
  
  std::gamma_distribution<double>::gamma_distribution(&local_50,*args,1.0);
  rVar1 = std::gamma_distribution<double>::operator()
                    (&local_50,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)this);
  return rVar1;
}

Assistant:

typename Dist::result_type get( Args&&... args ) {
            return Dist{ std::forward<Args>( args )... }( m_engine );
        }